

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

PrecisionRecallCurve *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::PrecisionRecallCurve>
          (Arena *arena)

{
  PrecisionRecallCurve *pPVar1;
  
  if (arena != (Arena *)0x0) {
    pPVar1 = DoCreateMessage<CoreML::Specification::PrecisionRecallCurve>(arena);
    return pPVar1;
  }
  pPVar1 = (PrecisionRecallCurve *)operator_new(0x38);
  CoreML::Specification::PrecisionRecallCurve::PrecisionRecallCurve(pPVar1,(Arena *)0x0,false);
  return pPVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }